

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O3

int64_t __thiscall RandomGen::binom_draw(RandomGen *this,int64_t N0,double prob)

{
  result_type_conflict2 rVar1;
  binomial_distribution<long> local_a0;
  
  local_a0._M_param._M_t = N0;
  local_a0._M_param._M_p = prob;
  std::binomial_distribution<long>::param_type::_M_initialize(&local_a0._M_param);
  local_a0._M_nd._M_param._M_mean._0_4_ = 0;
  local_a0._M_nd._M_param._M_mean._4_4_ = 0;
  local_a0._M_nd._M_param._M_stddev._0_4_ = 0;
  local_a0._M_nd._M_param._M_stddev._4_4_ = 0x3ff00000;
  local_a0._M_nd._M_saved = 0.0;
  local_a0._M_nd._M_saved_available = false;
  rVar1 = std::binomial_distribution<long>::operator()(&local_a0,&this->rng,&local_a0._M_param);
  return rVar1;
}

Assistant:

int64_t RandomGen::binom_draw(int64_t N0, double prob) {
  return std::binomial_distribution<int64_t>(N0, prob)(rng);
}